

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measure.cpp
# Opt level: O2

void __thiscall
icu_63::Measure::Measure(Measure *this,Formattable *_number,MeasureUnit *adoptedUnit,UErrorCode *ec)

{
  UBool UVar1;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Measure_003dc9d0;
  Formattable::Formattable(&this->number,_number);
  this->unit = adoptedUnit;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar1 = Formattable::isNumeric(&this->number);
    if ((adoptedUnit == (MeasureUnit *)0x0) || (UVar1 == '\0')) {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return;
}

Assistant:

Measure::Measure(const Formattable& _number, MeasureUnit* adoptedUnit,
                 UErrorCode& ec) :
    number(_number), unit(adoptedUnit) {
    if (U_SUCCESS(ec) &&
        (!number.isNumeric() || adoptedUnit == 0)) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
    }
}